

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall
tinygltf::AnimationSampler::operator==(AnimationSampler *this,AnimationSampler *other)

{
  bool bVar1;
  __type _Var2;
  
  bVar1 = Equals(&this->extras,&other->extras);
  if ((((bVar1) &&
       (bVar1 = std::operator==(&(this->extensions)._M_t,&(other->extensions)._M_t), bVar1)) &&
      (this->input == other->input)) &&
     (_Var2 = std::operator==(&this->interpolation,&other->interpolation), _Var2)) {
    return this->output == other->output;
  }
  return false;
}

Assistant:

bool AnimationSampler::operator==(const AnimationSampler &other) const {
  return this->extras == other.extras && this->extensions == other.extensions &&
         this->input == other.input &&
         this->interpolation == other.interpolation &&
         this->output == other.output;
}